

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-ioutil.cc
# Opt level: O0

void ioutil_test(void)

{
  bool bVar1;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"./",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"./dora",&local_81);
  tinyusdz::io::JoinPath(&local_28,&local_48,&local_80);
  bVar1 = std::operator==(&local_28,"./dora");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-ioutil.cc"
                 ,0xf,"%s","io::JoinPath(\"./\", \"./dora\") == \"./dora\"");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void ioutil_test(void) {
  {
    TEST_CHECK(io::JoinPath("./", "./dora") == "./dora");
  }
}